

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmap.h
# Opt level: O0

QPixmap * __thiscall QPixmap::operator=(QPixmap *this,QPixmap *other)

{
  QPixmap *in_RDI;
  long in_FS_OFFSET;
  QPixmap moved;
  QPixmap *this_00;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = (QPixmap *)&local_28;
  QPixmap(this_00,in_RDI);
  swap(this_00,in_RDI);
  ::QPixmap::~QPixmap(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

inline void swap(QPixmap &other) noexcept
    { data.swap(other.data); }